

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O2

LY_ERR lyd_value_validate(ly_ctx *ctx,lysc_node *schema,char *value,size_t value_len,
                         lyd_node *ctx_node,lysc_type **realtype,char **canonical)

{
  LY_ERR LVar1;
  LY_ERR LVar2;
  lysc_type *plVar3;
  char *pcVar4;
  ly_ctx *ctx_00;
  ly_err_item *err;
  lysc_node *local_68;
  lysc_type **local_60;
  lyd_value val;
  
  err = (ly_err_item *)0x0;
  val.field_2.dec64 = 0;
  val.field_2._8_8_ = 0;
  val._canonical = (char *)0x0;
  val.realtype = (lysc_type *)0x0;
  val.field_2._16_8_ = 0;
  if (schema == (lysc_node *)0x0) {
    pcVar4 = "schema";
LAB_00126259:
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar4,"lyd_value_validate");
    return LY_EINVAL;
  }
  if (value == (char *)0x0 && value_len != 0) {
    pcVar4 = "!value_len || value";
    goto LAB_00126259;
  }
  ctx_00 = ctx;
  if (ctx == (ly_ctx *)0x0) {
    ctx_00 = schema->module->ctx;
  }
  if (value_len == 0) {
    value = "";
  }
  local_68 = schema[1].parent;
  local_60 = realtype;
  LVar1 = (*(code *)local_68->parent->module)
                    (ctx_00,local_68,value,value_len,0,4,0,0x3f3,schema,&val,0,&err);
  LVar2 = LVar1;
  if ((ctx_node != (lyd_node *)0x0) && (LVar1 == LY_EINCOMPLETE)) {
    LVar2 = (*(code *)local_68->parent->parent)(ctx_00,local_68,ctx_node,ctx_node,&val,&err);
  }
  if (err == (ly_err_item *)0x0) {
LAB_001261ac:
    if ((LVar2 != LY_EINCOMPLETE) && (LVar2 != LY_SUCCESS)) goto LAB_0012620b;
  }
  else if ((LVar2 != LY_SUCCESS) && (LVar2 != LY_EINCOMPLETE)) {
    if (ctx != (ly_ctx *)0x0) {
      ly_err_print_build_path(ctx_00,ctx_node,schema,err);
    }
    ly_err_free(err);
    goto LAB_001261ac;
  }
  if (local_60 != (lysc_type **)0x0) {
    plVar3 = val.realtype;
    if ((val.realtype)->basetype == LY_TYPE_UNION) {
      plVar3 = (lysc_type *)(val.field_2.enum_item)->dsc;
    }
    *local_60 = plVar3;
  }
  if (canonical != (char **)0x0) {
    pcVar4 = (char *)(*(val.realtype)->plugin->print)
                               (ctx_00,&val,LY_VALUE_CANON,(void *)0x0,(ly_bool *)0x0,(size_t *)0x0)
    ;
    lydict_insert(ctx_00,pcVar4,0,canonical);
  }
LAB_0012620b:
  if ((LVar1 != LY_EINCOMPLETE) && (LVar1 != LY_SUCCESS)) {
    return LVar2;
  }
  if (ctx_00 == (ly_ctx *)0x0) {
    ctx_00 = schema->module->ctx;
  }
  (*(code *)local_68->parent->ref)(ctx_00,&val);
  return LVar2;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_value_validate(const struct ly_ctx *ctx, const struct lysc_node *schema, const char *value, size_t value_len,
        const struct lyd_node *ctx_node, const struct lysc_type **realtype, const char **canonical)
{
    LY_ERR rc;
    struct ly_err_item *err = NULL;
    struct lysc_type *type;
    struct lyd_value val = {0};
    ly_bool stored = 0, log = 1;

    LY_CHECK_ARG_RET(ctx, schema, !value_len || value, LY_EINVAL);

    if (!ctx) {
        ctx = schema->module->ctx;
        log = 0;
    }
    if (!value_len) {
        value = "";
    }
    type = ((struct lysc_node_leaf *)schema)->type;

    /* store */
    rc = type->plugin->store(ctx, type, value, value_len, 0, LY_VALUE_JSON, NULL,
            LYD_HINT_DATA, schema, &val, NULL, &err);
    if (!rc || (rc == LY_EINCOMPLETE)) {
        stored = 1;
    }

    if (ctx_node && (rc == LY_EINCOMPLETE)) {
        /* resolve */
        rc = type->plugin->validate(ctx, type, ctx_node, ctx_node, &val, &err);
    }

    if (rc && (rc != LY_EINCOMPLETE) && err) {
        if (log) {
            /* log error */
            ly_err_print_build_path(ctx, ctx_node, schema, err);
        }
        ly_err_free(err);
    }

    if (!rc || (rc == LY_EINCOMPLETE)) {
        if (realtype) {
            /* return realtype */
            if (val.realtype->basetype == LY_TYPE_UNION) {
                *realtype = val.subvalue->value.realtype;
            } else {
                *realtype = val.realtype;
            }
        }

        if (canonical) {
            /* return canonical value */
            lydict_insert(ctx, val.realtype->plugin->print(ctx, &val, LY_VALUE_CANON, NULL, NULL, NULL), 0, canonical);
        }
    }

    if (stored) {
        /* free value */
        type->plugin->free(ctx ? ctx : schema->module->ctx, &val);
    }
    return rc;
}